

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O0

bool aux_positioning_horizontal(Board *board,int row,int col,Ship ship)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int local_30;
  int local_2c;
  int j_1;
  int i_1;
  int j;
  int i;
  int col_local;
  int row_local;
  Board *board_local;
  
  if (ship.orientation == 'H') {
    if (ship.direction == 1) {
      for (i_1 = row + -1; i_1 <= row + 1; i_1 = i_1 + 1) {
        for (j_1 = col + -1; j_1 <= col + ship.length; j_1 = j_1 + 1) {
          if (((-1 < i_1) && (i_1 <= board->row + -1)) &&
             ((-1 < j_1 && (j_1 <= board->column + -1)))) {
            pvVar2 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&board->matrix,(long)i_1);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](pvVar2,(long)j_1);
            bVar1 = std::operator!=(pvVar3,"~");
            if (bVar1) {
              return false;
            }
          }
        }
      }
    }
    else if (ship.direction == -1) {
      for (local_2c = row + -1; local_2c <= row + 1; local_2c = local_2c + 1) {
        for (local_30 = col + 1; col - ship.length <= local_30; local_30 = local_30 + -1) {
          if ((((-1 < local_2c) && (local_2c <= board->row + -1)) && (-1 < local_30)) &&
             (local_30 <= board->column + -1)) {
            pvVar2 = std::
                     vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[](&board->matrix,(long)local_2c);
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](pvVar2,(long)local_30);
            bVar1 = std::operator!=(pvVar3,"~");
            if (bVar1) {
              return false;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool aux_positioning_horizontal( Board *board, int row, int col, Ship ship )
{
    if( ship.orientation == 'H' )
    {
        if( ship.direction == 1 )
        {
            for( int i = row - 1; i <= row + 1; i++ )
            {
                for( int j = col - 1; j <= col + ship.length; j++ )
                {

                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                        continue;
                    }

                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
        else if( ship.direction == -1 )
        {
            for( int i = row - 1; i <= row + 1; i++ )
            {
                for( int j = col + 1; j >= col - ship.length; j-- )
                {
                  if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                  {
                      continue;
                  }

                  if( board->matrix[i][j] != "~" )
                  {
                      return false;
                  }
                }
            }
        }
    }

    return true;
}